

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_variables.c
# Opt level: O0

ngx_int_t ngx_stream_variable_hostname
                    (ngx_stream_session_t *s,ngx_stream_variable_value_t *v,uintptr_t data)

{
  uintptr_t data_local;
  ngx_stream_variable_value_t *v_local;
  ngx_stream_session_t *s_local;
  
  *(uint *)v = *(uint *)v & 0xf0000000 | (uint)(ngx_cycle->hostname).len & 0xfffffff;
  *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
  *(uint *)v = *(uint *)v & 0xdfffffff;
  *(uint *)v = *(uint *)v & 0xbfffffff;
  v->data = (ngx_cycle->hostname).data;
  return 0;
}

Assistant:

static ngx_int_t
ngx_stream_variable_hostname(ngx_stream_session_t *s,
    ngx_stream_variable_value_t *v, uintptr_t data)
{
    v->len = ngx_cycle->hostname.len;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;
    v->data = ngx_cycle->hostname.data;

    return NGX_OK;
}